

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactBvh.cpp
# Opt level: O1

int __thiscall
cbtBvhTree::_sort_and_calc_splitting_index
          (cbtBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex,
          int splitAxis)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  GIM_BVH_DATA *pGVar3;
  GIM_BVH_DATA *pGVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  cbtScalar *pcVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_68 [2];
  ulong uStack_60;
  undefined1 local_58 [16];
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  cbtVector3 center;
  
  iVar11 = endIndex - startIndex;
  fVar17 = 0.0;
  lVar15 = (long)startIndex;
  fVar19 = 0.0;
  fVar18 = 0.0;
  if (iVar11 != 0 && startIndex <= endIndex) {
    pcVar14 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data[lVar15].m_bound.
              m_max.m_floats + 2;
    lVar16 = endIndex - lVar15;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar17 = 0.0;
    do {
      fVar18 = (((cbtVector3 *)(pcVar14 + -2))->m_floats[0] + pcVar14[-6]) * 0.5 + fVar18;
      fVar19 = (pcVar14[-1] + pcVar14[-5]) * 0.5 + fVar19;
      fVar17 = (*pcVar14 + pcVar14[-4]) * 0.5 + fVar17;
      pcVar14 = pcVar14 + 9;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  fVar20 = 1.0 / (float)iVar11;
  local_68[1] = fVar20 * fVar19;
  local_68[0] = fVar20 * fVar18;
  uStack_60 = (ulong)(uint)(fVar20 * fVar17);
  iVar13 = startIndex;
  if (startIndex < endIndex) {
    fVar18 = local_68[splitAxis];
    lVar16 = lVar15 * 0x24;
    lVar15 = endIndex - lVar15;
    do {
      pGVar3 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data;
      auVar5 = vinsertps_avx(ZEXT416((uint)((*(float *)((long)(pGVar3->m_bound).m_max.m_floats +
                                                       lVar16) +
                                            *(float *)((long)(pGVar3->m_bound).m_min.m_floats +
                                                      lVar16)) * 0.5)),
                             ZEXT416((uint)((*(float *)((long)(pGVar3->m_bound).m_max.m_floats +
                                                       lVar16 + 4) +
                                            *(float *)((long)(pGVar3->m_bound).m_min.m_floats +
                                                      lVar16 + 4)) * 0.5)),0x10);
      local_58 = vinsertps_avx(auVar5,ZEXT416((uint)((*(float *)((long)(pGVar3->m_bound).m_max.
                                                                       m_floats + lVar16 + 8) +
                                                     *(float *)((long)(pGVar3->m_bound).m_min.
                                                                      m_floats + lVar16 + 8)) * 0.5)
                                             ),0x28);
      if (fVar18 < *(float *)(local_58 + (long)splitAxis * 4)) {
        puVar1 = (undefined8 *)((long)(pGVar3->m_bound).m_min.m_floats + lVar16);
        puVar2 = (undefined8 *)((long)(pGVar3->m_bound).m_max.m_floats + lVar16);
        uStack_48 = *puVar1;
        uStack_40 = puVar1[1];
        uStack_38 = *puVar2;
        uVar6 = puVar2[1];
        center.m_floats[0] = (cbtScalar)uVar6;
        center.m_floats[1] = SUB84(uVar6,4);
        iVar10 = *(int *)(puVar2 + 2);
        pGVar4 = pGVar3 + iVar13;
        uVar7 = *(undefined8 *)((pGVar4->m_bound).m_min.m_floats + 2);
        uVar8 = *(undefined8 *)(pGVar4->m_bound).m_max.m_floats;
        uVar9 = *(undefined8 *)((pGVar4->m_bound).m_max.m_floats + 2);
        *puVar1 = *(undefined8 *)(pGVar4->m_bound).m_min.m_floats;
        puVar1[1] = uVar7;
        puVar1[2] = uVar8;
        puVar1[3] = uVar9;
        *(int *)(puVar1 + 4) = pGVar3[iVar13].m_data;
        pGVar4 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data;
        pGVar3 = pGVar4 + iVar13;
        *(undefined8 *)(pGVar3->m_bound).m_min.m_floats = uStack_48;
        *(undefined8 *)((pGVar3->m_bound).m_min.m_floats + 2) = uStack_40;
        *(undefined8 *)(pGVar3->m_bound).m_max.m_floats = uStack_38;
        *(undefined8 *)((pGVar3->m_bound).m_max.m_floats + 2) = uVar6;
        pGVar4[iVar13].m_data = iVar10;
        iVar13 = iVar13 + 1;
      }
      lVar16 = lVar16 + 0x24;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  iVar12 = (iVar11 >> 1) + startIndex;
  iVar10 = iVar13;
  if (~(iVar11 / 3) + endIndex <= iVar13) {
    iVar10 = iVar12;
  }
  if (iVar13 <= iVar11 / 3 + startIndex) {
    iVar10 = iVar12;
  }
  return iVar10;
}

Assistant:

int cbtBvhTree::_sort_and_calc_splitting_index(
	GIM_BVH_DATA_ARRAY& primitive_boxes, int startIndex,
	int endIndex, int splitAxis)
{
	int i;
	int splitIndex = startIndex;
	int numIndices = endIndex - startIndex;

	// average of centers
	cbtScalar splitValue = 0.0f;

	cbtVector3 means(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (primitive_boxes[i].m_bound.m_max +
											primitive_boxes[i].m_bound.m_min);
		means += center;
	}
	means *= (cbtScalar(1.) / (cbtScalar)numIndices);

	splitValue = means[splitAxis];

	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (primitive_boxes[i].m_bound.m_max +
											primitive_boxes[i].m_bound.m_min);
		if (center[splitAxis] > splitValue)
		{
			//swap
			primitive_boxes.swap(i, splitIndex);
			//swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices / 3;
	bool unbalanced = ((splitIndex <= (startIndex + rangeBalancedIndices)) || (splitIndex >= (endIndex - 1 - rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex + (numIndices >> 1);
	}

	cbtAssert(!((splitIndex == startIndex) || (splitIndex == (endIndex))));

	return splitIndex;
}